

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.h
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::~QGraphicsAnchorLayoutPrivate(QGraphicsAnchorLayoutPrivate *this)

{
  int *piVar1;
  Data *pDVar2;
  long lVar3;
  
  (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
  _vptr_QGraphicsLayoutItemPrivate = (_func_int **)&PTR__QGraphicsAnchorLayoutPrivate_0081f208;
  QStyleOption::~QStyleOption(&(this->cachedStyleInfo).m_styleOption);
  lVar3 = 0x2b8;
  do {
    QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash
              ((QHash<QGraphicsLayoutItem_*,_QHashDummyValue> *)
               ((long)&((QGraphicsLayoutItemPrivate *)
                       ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
                        cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != 0x2a8);
  lVar3 = 0x278;
  do {
    piVar1 = *(int **)((long)&((QGraphicsLayoutItemPrivate *)
                              ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate
                               .cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)
                    ((long)&((QGraphicsLayoutItemPrivate *)
                            ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
                             cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3),8,
                   0x10);
      }
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x248);
  lVar3 = 0x248;
  do {
    piVar1 = *(int **)((long)&((QGraphicsLayoutItemPrivate *)
                              ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate
                               .cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)
                    ((long)&((QGraphicsLayoutItemPrivate *)
                            ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
                             cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3),8,
                   0x10);
      }
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x218);
  lVar3 = 0x220;
  do {
    QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
    ~QMultiHash((QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                 *)((long)&((QGraphicsLayoutItemPrivate *)
                           ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
                            cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0x200);
  lVar3 = 0x1f8;
  do {
    piVar1 = *(int **)((long)&((QGraphicsLayoutItemPrivate *)
                              ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate
                               .cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)
                    ((long)&((QGraphicsLayoutItemPrivate *)
                            ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
                             cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3),8,
                   0x10);
      }
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x1c8);
  lVar3 = 0x1c8;
  do {
    piVar1 = *(int **)((long)&((QGraphicsLayoutItemPrivate *)
                              ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate
                               .cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)
                    ((long)&((QGraphicsLayoutItemPrivate *)
                            ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
                             cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3),8,
                   0x10);
      }
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0x198);
  lVar3 = 0x178;
  do {
    QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
    ::~QHash((QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
              *)((long)&((QGraphicsLayoutItemPrivate *)
                        ((this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
                         cachedSizeHints + -2))->_vptr_QGraphicsLayoutItemPrivate + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != 0x168);
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  ::~QHash(&this->m_vertexList);
  pDVar2 = (this->items).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->items).d.d)->super_QArrayData,8,0x10);
    }
  }
  QGraphicsLayoutItemPrivate::~QGraphicsLayoutItemPrivate((QGraphicsLayoutItemPrivate *)this);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QGraphicsAnchorLayoutPrivate : public QGraphicsLayoutPrivate
{
    Q_DECLARE_PUBLIC(QGraphicsAnchorLayout)

public:
    // When the layout geometry is different from its Minimum, Preferred
    // or Maximum values, interpolation is used to calculate the geometries
    // of the items.
    //
    // Interval represents which interpolation interval are we operating in.
    enum Interval {
        MinimumToMinPreferred = 0,
        MinPreferredToPreferred,
        PreferredToMaxPreferred,
        MaxPreferredToMaximum
    };

    typedef Qt::Orientation Orientation [[deprecated]];
    [[deprecated]] static inline constexpr Qt::Orientation Horizontal = Qt::Horizontal;
    [[deprecated]] static inline constexpr Qt::Orientation Vertical = Qt::Vertical;

    QGraphicsAnchorLayoutPrivate();

    static QGraphicsAnchorLayoutPrivate *get(QGraphicsAnchorLayout *q)
    {
        return q ? q->d_func() : nullptr;
    }

    static Qt::AnchorPoint oppositeEdge(
        Qt::AnchorPoint edge);

    static Qt::Orientation edgeOrientation(Qt::AnchorPoint edge) noexcept;

    static Qt::AnchorPoint pickEdge(Qt::AnchorPoint edge, Qt::Orientation orientation)
    {
        if (orientation == Qt::Vertical && int(edge) <= 2)
            return (Qt::AnchorPoint)(edge + 3);
        else if (orientation == Qt::Horizontal && int(edge) >= 3) {
            return (Qt::AnchorPoint)(edge - 3);
        }
        return edge;
    }

    // Init methods
    void createLayoutEdges();
    void deleteLayoutEdges();
    void createItemEdges(QGraphicsLayoutItem *item);
    void createCenterAnchors(QGraphicsLayoutItem *item, Qt::AnchorPoint centerEdge);
    void removeCenterAnchors(QGraphicsLayoutItem *item, Qt::AnchorPoint centerEdge, bool substitute = true);
    void removeCenterConstraints(QGraphicsLayoutItem *item, Qt::Orientation orientation);

    QGraphicsAnchor *acquireGraphicsAnchor(AnchorData *data)
    {
        Q_Q(QGraphicsAnchorLayout);
        if (!data->graphicsAnchor) {
            data->graphicsAnchor = new QGraphicsAnchor(q);
            data->graphicsAnchor->d_func()->data = data;
        }
        return data->graphicsAnchor;
    }

    // function used by the 4 API functions
    QGraphicsAnchor *addAnchor(QGraphicsLayoutItem *firstItem,
                            Qt::AnchorPoint firstEdge,
                            QGraphicsLayoutItem *secondItem,
                            Qt::AnchorPoint secondEdge,
                            qreal *spacing = nullptr);

    // Helper for Anchor Manipulation methods
    void addAnchor_helper(QGraphicsLayoutItem *firstItem,
                   Qt::AnchorPoint firstEdge,
                   QGraphicsLayoutItem *secondItem,
                   Qt::AnchorPoint secondEdge,
                   AnchorData *data);

    QGraphicsAnchor *getAnchor(QGraphicsLayoutItem *firstItem, Qt::AnchorPoint firstEdge,
                               QGraphicsLayoutItem *secondItem, Qt::AnchorPoint secondEdge);

    void removeAnchor(AnchorVertex *firstVertex, AnchorVertex *secondVertex);
    void removeAnchor_helper(AnchorVertex *v1, AnchorVertex *v2);

    void removeAnchors(QGraphicsLayoutItem *item);

    void removeVertex(QGraphicsLayoutItem *item, Qt::AnchorPoint edge);

    void correctEdgeDirection(QGraphicsLayoutItem *&firstItem,
                              Qt::AnchorPoint &firstEdge,
                              QGraphicsLayoutItem *&secondItem,
                              Qt::AnchorPoint &secondEdge);

    QLayoutStyleInfo &styleInfo() const;

    AnchorData *addAnchorMaybeParallel(AnchorData *newAnchor, bool *feasible);

    // Activation
    void calculateGraphs();
    void calculateGraphs(Qt::Orientation orientation);

    // Simplification
    bool simplifyGraph(Qt::Orientation orientation);
    bool simplifyVertices(Qt::Orientation orientation);
    bool simplifyGraphIteration(Qt::Orientation orientation, bool *feasible);

    bool replaceVertex(Qt::Orientation orientation, AnchorVertex *oldV,
                       AnchorVertex *newV, const QList<AnchorData *> &edges);


    void restoreSimplifiedGraph(Qt::Orientation orientation);
    void restoreSimplifiedAnchor(AnchorData *edge);
    void restoreSimplifiedConstraints(ParallelAnchorData *parallel);
    void restoreVertices(Qt::Orientation orientation);

    bool calculateTrunk(Qt::Orientation orientation, const GraphPath &trunkPath,
                        const QList<QSimplexConstraint *> &constraints,
                        const QList<AnchorData *> &variables);
    bool calculateNonTrunk(const QList<QSimplexConstraint *> &constraints,
                           const QList<AnchorData *> &variables);

    // Support functions for calculateGraph()
    void refreshAllSizeHints(Qt::Orientation orientation);
    void findPaths(Qt::Orientation orientation);
    void constraintsFromPaths(Qt::Orientation orientation);
    void updateAnchorSizes(Qt::Orientation orientation);
    QList<QSimplexConstraint *> constraintsFromSizeHints(const QList<AnchorData *> &anchors);
    struct GraphParts {
        QList<QSimplexConstraint *> trunkConstraints;
        QList<QSimplexConstraint *> nonTrunkConstraints;
    };
    GraphParts getGraphParts(Qt::Orientation orientation);
    void identifyFloatItems(const QSet<AnchorData *> &visited, Qt::Orientation orientation);
    void identifyNonFloatItems_helper(const AnchorData *ad, QSet<QGraphicsLayoutItem *> *nonFloatingItemsIdentifiedSoFar);

    inline AnchorVertex *internalVertex(const std::pair<QGraphicsLayoutItem*, Qt::AnchorPoint> &itemEdge) const
    {
        return m_vertexList.value(itemEdge).first;
    }

    inline AnchorVertex *internalVertex(const QGraphicsLayoutItem *item, Qt::AnchorPoint edge) const
    {
        return internalVertex(std::pair(const_cast<QGraphicsLayoutItem *>(item), edge));
    }

    inline void changeLayoutVertex(Qt::Orientation orientation, AnchorVertex *oldV, AnchorVertex *newV)
    {
        if (layoutFirstVertex[orientation] == oldV)
            layoutFirstVertex[orientation] = newV;
        else if (layoutCentralVertex[orientation] == oldV)
            layoutCentralVertex[orientation] = newV;
        else if (layoutLastVertex[orientation] == oldV)
            layoutLastVertex[orientation] = newV;
    }


    AnchorVertex *addInternalVertex(QGraphicsLayoutItem *item, Qt::AnchorPoint edge);
    void removeInternalVertex(QGraphicsLayoutItem *item, Qt::AnchorPoint edge);

    // Geometry interpolation methods
    void setItemsGeometries(const QRectF &geom);

    void calculateVertexPositions(Qt::Orientation orientation);
    void setupEdgesInterpolation(Qt::Orientation orientation);
    void interpolateEdge(AnchorVertex *base, AnchorData *edge);

    // Linear Programming solver methods
    bool solveMinMax(const QList<QSimplexConstraint *> &constraints,
                     const GraphPath &path, qreal *min, qreal *max);
    bool solvePreferred(const QList<QSimplexConstraint *> &constraints,
                        const QList<AnchorData *> &variables);
    bool hasConflicts() const;

#ifdef QT_DEBUG
    void dumpGraph(const QString &name = QString());
#endif


    QHVContainer<qreal> spacings = {-1, -1};
    // Size hints from simplex engine
    QHVContainer<std::array<qreal, 3>> sizeHints = {{-1, -1, -1}, {-1, -1, -1}};

    // Items
    QList<QGraphicsLayoutItem *> items;

    // Mapping between high level anchorage points (Item, Edge) to low level
    // ones (Graph Vertices)

    QHash<std::pair<QGraphicsLayoutItem*, Qt::AnchorPoint>, std::pair<AnchorVertex *, int> > m_vertexList;

    // Internal graph of anchorage points and anchors, for both orientations
    QHVContainer<Graph<AnchorVertex, AnchorData>> graph;

    QHVContainer<AnchorVertex *> layoutFirstVertex = {};
    QHVContainer<AnchorVertex *> layoutCentralVertex = {};
    QHVContainer<AnchorVertex *> layoutLastVertex = {};

    // Combined anchors in order of creation
    QHVContainer<QList<AnchorVertexPair *>> simplifiedVertices;
    QHVContainer<QList<AnchorData *>> anchorsFromSimplifiedVertices;

    // Graph paths and constraints, for both orientations
    QHVContainer<QMultiHash<AnchorVertex *, GraphPath>> graphPaths;
    QHVContainer<QList<QSimplexConstraint *>> constraints;
    QHVContainer<QList<QSimplexConstraint *>> itemCenterConstraints;

    // The interpolation interval and progress based on the current size
    // as well as the key values (minimum, preferred and maximum)
    QHVContainer<Interval> interpolationInterval;
    QHVContainer<qreal> interpolationProgress = {-1, -1};

    QHVContainer<bool> graphHasConflicts = {};
    QHVContainer<QSet<QGraphicsLayoutItem *>> m_floatItems;

#if defined(QT_DEBUG) || defined(QT_BUILD_INTERNAL)
    QHVContainer<bool> lastCalculationUsedSimplex;
#endif

    uint calculateGraphCacheDirty : 1;
    mutable uint styleInfoDirty : 1;
    mutable QLayoutStyleInfo cachedStyleInfo;

    friend class QGraphicsAnchorPrivate;
}